

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O2

void __thiscall depspawn::internal::arg_info::insert_in_arglist(arg_info *this,arg_info **args)

{
  bool bVar1;
  arg_info *paVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  arg_info *paStack_8;
  
  paVar2 = *args;
  if (paVar2 != (arg_info *)0x0) {
    uVar3 = this->addr;
    uVar5 = paVar2->addr;
    if (uVar5 <= uVar3) {
      do {
        paStack_8 = paVar2;
        paVar2 = paStack_8->next;
        if (paVar2 == (arg_info *)0x0) {
          if ((this->rank != '\0') || (uVar3 != uVar5)) {
            paStack_8->next = this;
            return;
          }
          goto depspawn_internal_arg_info_solve_overlap;
        }
        uVar5 = paVar2->addr;
      } while (uVar5 <= uVar3);
      if ((this->rank != '\0') || (uVar3 != paStack_8->addr)) {
        paStack_8->next = this;
        this->next = paVar2;
        return;
      }
depspawn_internal_arg_info_solve_overlap:
      bVar1 = this->wr;
      bVar4 = true;
      if (bVar1 == false) {
        bVar4 = paStack_8->wr;
      }
      uVar3 = this->size;
      uVar5 = paStack_8->size;
      if (uVar3 - uVar5 == 0) {
        paStack_8->wr = bVar4;
      }
      else if (uVar3 < uVar5) {
        bVar1 = paStack_8->wr;
        if (bVar4 != bVar1) {
          this->addr = this->addr + uVar3;
          this->size = uVar5 - uVar3;
          this->wr = bVar1;
          paStack_8->size = uVar3;
          paStack_8->wr = bVar4;
LAB_0010d9c5:
          insert_in_arglist(this,&paStack_8);
          return;
        }
      }
      else {
        if (bVar1 != bVar4) {
          this->addr = this->addr + uVar5;
          this->size = uVar3 - uVar5;
          goto LAB_0010d9c5;
        }
        paStack_8->wr = bVar1;
        paStack_8->size = uVar3;
      }
      LinkedListPool<depspawn::internal::arg_info,_true,_false>::free
                ((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)Pool,this);
      return;
    }
    this->next = paVar2;
  }
  *args = this;
  return;
}

Assistant:

void arg_info::insert_in_arglist(arg_info*& args)
    { arg_info *p, *prev;
      
      if(!args) {
	args = this;
      } else if(addr < args->addr) {
	next = args;
	args = this;
      } else {
	
	prev = args;
	p = args->next;
	while(p) {
	  if(addr < p->addr) {
	    if( !is_array() && (addr == prev->addr) ) //Arrays are inserted replicated
	      solve_overlap(prev);
	    else {
	      prev->next = this;
	      next = p;
	    }
	    break;
	  }
	  prev = p;
	  p = p->next;
	}
	
        if(!p) {
          if( !is_array() && (addr == prev->addr) ) { //Arrays are inserted replicated
	    solve_overlap(prev);
          } else {
	    prev->next = this;
          }
        }
      }
      
    }